

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

TPZSkylMatrix<std::complex<double>_> * __thiscall
TPZSkylMatrix<std::complex<double>_>::operator+
          (TPZSkylMatrix<std::complex<double>_> *__return_storage_ptr__,
          TPZSkylMatrix<std::complex<double>_> *this,TPZSkylMatrix<std::complex<double>_> *A)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  complex<double> *pcVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar9;
  long lVar10;
  bool bVar11;
  
  iVar7 = (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(this);
  iVar8 = (*(A->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(A);
  if (CONCAT44(extraout_var,iVar7) != CONCAT44(extraout_var_00,iVar8)) {
    TPZMatrix<std::complex<double>_>::Error
              ("TPZSkylMatrix<TVar> TPZSkylMatrix<std::complex<double>>::operator+(const TPZSkylMatrix<TVar> &) const [TVar = std::complex<double>]"
               ,"<incompatible dimensions>");
  }
  (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0x4a])(this,this,A);
  TPZSkylMatrix(__return_storage_ptr__,this);
  lVar9 = (__return_storage_ptr__->fStorage).fNElements;
  lVar10 = 0;
  if (lVar9 < 1) {
    lVar9 = lVar10;
  }
  while (bVar11 = lVar9 != 0, lVar9 = lVar9 + -1, bVar11) {
    pcVar4 = (__return_storage_ptr__->fStorage).fStore;
    pdVar1 = (double *)(((A->fStorage).fStore)->_M_value + lVar10);
    dVar5 = pdVar1[1];
    pdVar2 = (double *)(pcVar4->_M_value + lVar10);
    dVar6 = pdVar2[1];
    pdVar3 = (double *)(pcVar4->_M_value + lVar10);
    *pdVar3 = *pdVar2 + *pdVar1;
    pdVar3[1] = dVar6 + dVar5;
    lVar10 = lVar10 + 0x10;
  }
  return __return_storage_ptr__;
}

Assistant:

TPZSkylMatrix<TVar>
TPZSkylMatrix<TVar>::operator+(const TPZSkylMatrix<TVar> &A) const
{
  
	if ( this->Dim() != A.Dim() )
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"<incompatible dimensions>" );
  CheckTypeCompatibility(this,&A);
	auto res(*this);
  const auto size = res.fStorage.size();
  for(auto i = 0; i < size; i++) res.fStorage[i] += A.fStorage[i];
	return res;
}